

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsd.h
# Opt level: O2

int bsd_create_socket(int domain,int type,int protocol)

{
  int __fd;
  uint uVar1;
  
  __fd = socket(domain,type | 0x80800,protocol);
  uVar1 = fcntl(__fd,3,0);
  fcntl(__fd,4,(ulong)(uVar1 | 0x800));
  return __fd;
}

Assistant:

static inline LIBUS_SOCKET_DESCRIPTOR bsd_create_socket(int domain, int type, int protocol) {
    // returns INVALID_SOCKET on error
    int flags = 0;
#if defined(SOCK_CLOEXEC) && defined(SOCK_NONBLOCK)
    flags = SOCK_CLOEXEC | SOCK_NONBLOCK;
#endif

    LIBUS_SOCKET_DESCRIPTOR created_fd = socket(domain, type | flags, protocol);

    return bsd_set_nonblocking(apple_no_sigpipe(created_fd));
}